

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred_avx2.c
# Opt level: O3

void uavs3d_if_ver_chroma_w128_avx2
               (pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff,int max_val)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  undefined2 uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  long lVar8;
  undefined1 (*pauVar9) [32];
  undefined1 (*pauVar10) [32];
  undefined1 (*pauVar11) [32];
  undefined1 (*pauVar12) [32];
  undefined1 (*pauVar13) [32];
  undefined1 (*pauVar14) [32];
  long lVar15;
  undefined1 (*pauVar16) [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  
  if (height != 0) {
    lVar15 = (long)i_src;
    pauVar16 = (undefined1 (*) [32])(src + -lVar15);
    uVar3 = *(undefined2 *)(coeff + 2);
    auVar17._2_2_ = uVar3;
    auVar17._0_2_ = uVar3;
    auVar17._4_2_ = uVar3;
    auVar17._6_2_ = uVar3;
    auVar17._8_2_ = uVar3;
    auVar17._10_2_ = uVar3;
    auVar17._12_2_ = uVar3;
    auVar17._14_2_ = uVar3;
    auVar17._16_2_ = uVar3;
    auVar17._18_2_ = uVar3;
    auVar17._20_2_ = uVar3;
    auVar17._22_2_ = uVar3;
    auVar17._24_2_ = uVar3;
    auVar17._26_2_ = uVar3;
    auVar17._28_2_ = uVar3;
    auVar17._30_2_ = uVar3;
    uVar3 = *(undefined2 *)coeff;
    auVar18._2_2_ = uVar3;
    auVar18._0_2_ = uVar3;
    auVar18._4_2_ = uVar3;
    auVar18._6_2_ = uVar3;
    auVar18._8_2_ = uVar3;
    auVar18._10_2_ = uVar3;
    auVar18._12_2_ = uVar3;
    auVar18._14_2_ = uVar3;
    auVar18._16_2_ = uVar3;
    auVar18._18_2_ = uVar3;
    auVar18._20_2_ = uVar3;
    auVar18._22_2_ = uVar3;
    auVar18._24_2_ = uVar3;
    auVar18._26_2_ = uVar3;
    auVar18._28_2_ = uVar3;
    auVar18._30_2_ = uVar3;
    lVar8 = lVar15 * 3;
    auVar19._8_2_ = 0x20;
    auVar19._0_8_ = 0x20002000200020;
    auVar19._10_2_ = 0x20;
    auVar19._12_2_ = 0x20;
    auVar19._14_2_ = 0x20;
    auVar19._16_2_ = 0x20;
    auVar19._18_2_ = 0x20;
    auVar19._20_2_ = 0x20;
    auVar19._22_2_ = 0x20;
    auVar19._24_2_ = 0x20;
    auVar19._26_2_ = 0x20;
    auVar19._28_2_ = 0x20;
    auVar19._30_2_ = 0x20;
    do {
      auVar20 = vpunpcklbw_avx2(*pauVar16,*(undefined1 (*) [32])(*pauVar16 + lVar15));
      auVar21 = vpunpcklbw_avx2(*(undefined1 (*) [32])(*pauVar16 + lVar15 * 2),
                                *(undefined1 (*) [32])(*pauVar16 + lVar8));
      auVar22 = vpunpckhbw_avx2(*pauVar16,*(undefined1 (*) [32])(*pauVar16 + lVar15));
      auVar4 = vpunpckhbw_avx2(*(undefined1 (*) [32])(*pauVar16 + lVar15 * 2),
                               *(undefined1 (*) [32])(*pauVar16 + lVar8));
      auVar6 = vpunpcklbw_avx2(pauVar16[1],*(undefined1 (*) [32])(pauVar16[1] + lVar15));
      auVar7 = vpunpcklbw_avx2(*(undefined1 (*) [32])(pauVar16[1] + lVar15 * 2),
                               *(undefined1 (*) [32])(pauVar16[1] + lVar8));
      auVar23 = vpunpckhbw_avx2(pauVar16[1],*(undefined1 (*) [32])(pauVar16[1] + lVar15));
      auVar5 = vpunpckhbw_avx2(*(undefined1 (*) [32])(pauVar16[1] + lVar15 * 2),
                               *(undefined1 (*) [32])(pauVar16[1] + lVar8));
      auVar20 = vpmaddubsw_avx2(auVar20,auVar18);
      auVar21 = vpmaddubsw_avx2(auVar21,auVar17);
      auVar20 = vpaddw_avx2(auVar20,auVar21);
      auVar21 = vpmaddubsw_avx2(auVar22,auVar18);
      auVar22 = vpmaddubsw_avx2(auVar4,auVar17);
      auVar21 = vpaddw_avx2(auVar21,auVar22);
      auVar22 = vpmaddubsw_avx2(auVar6,auVar18);
      auVar4 = vpmaddubsw_avx2(auVar7,auVar17);
      auVar22 = vpaddw_avx2(auVar22,auVar4);
      auVar4 = vpmaddubsw_avx2(auVar23,auVar18);
      auVar23 = vpmaddubsw_avx2(auVar5,auVar17);
      auVar4 = vpaddw_avx2(auVar4,auVar23);
      auVar20 = vpaddw_avx2(auVar20,auVar19);
      auVar21 = vpaddw_avx2(auVar21,auVar19);
      auVar22 = vpaddw_avx2(auVar22,auVar19);
      auVar4 = vpaddw_avx2(auVar4,auVar19);
      auVar23 = vpsraw_avx2(auVar20,6);
      auVar20 = vpsraw_avx2(auVar21,6);
      auVar20 = vpackuswb_avx2(auVar23,auVar20);
      auVar22 = vpsraw_avx2(auVar22,6);
      auVar21 = vpsraw_avx2(auVar4,6);
      auVar21 = vpackuswb_avx2(auVar22,auVar21);
      *(undefined1 (*) [32])dst = auVar20;
      *(undefined1 (*) [32])((long)dst + 0x20) = auVar21;
      pauVar1 = pauVar16 + 2;
      pauVar2 = pauVar16 + 3;
      pauVar9 = pauVar16 + 2;
      pauVar10 = pauVar16 + 3;
      pauVar11 = pauVar16 + 2;
      pauVar12 = pauVar16 + 3;
      pauVar13 = pauVar16 + 2;
      pauVar14 = pauVar16 + 3;
      pauVar16 = (undefined1 (*) [32])(*pauVar16 + lVar15);
      auVar20 = vpunpcklbw_avx2(*pauVar1,*(undefined1 (*) [32])(*pauVar9 + lVar15));
      auVar21 = vpunpcklbw_avx2(*(undefined1 (*) [32])(*pauVar11 + lVar15 * 2),
                                *(undefined1 (*) [32])(*pauVar13 + lVar8));
      auVar22 = vpunpckhbw_avx2(*pauVar1,*(undefined1 (*) [32])(*pauVar9 + lVar15));
      auVar4 = vpunpckhbw_avx2(*(undefined1 (*) [32])(*pauVar11 + lVar15 * 2),
                               *(undefined1 (*) [32])(*pauVar13 + lVar8));
      auVar6 = vpunpcklbw_avx2(*pauVar2,*(undefined1 (*) [32])(*pauVar10 + lVar15));
      auVar7 = vpunpcklbw_avx2(*(undefined1 (*) [32])(*pauVar12 + lVar15 * 2),
                               *(undefined1 (*) [32])(*pauVar14 + lVar8));
      auVar23 = vpunpckhbw_avx2(*pauVar2,*(undefined1 (*) [32])(*pauVar10 + lVar15));
      auVar5 = vpunpckhbw_avx2(*(undefined1 (*) [32])(*pauVar12 + lVar15 * 2),
                               *(undefined1 (*) [32])(*pauVar14 + lVar8));
      auVar20 = vpmaddubsw_avx2(auVar20,auVar18);
      auVar21 = vpmaddubsw_avx2(auVar21,auVar17);
      auVar20 = vpaddw_avx2(auVar20,auVar21);
      auVar21 = vpmaddubsw_avx2(auVar22,auVar18);
      auVar22 = vpmaddubsw_avx2(auVar4,auVar17);
      auVar21 = vpaddw_avx2(auVar21,auVar22);
      auVar22 = vpmaddubsw_avx2(auVar6,auVar18);
      auVar4 = vpmaddubsw_avx2(auVar7,auVar17);
      auVar22 = vpaddw_avx2(auVar22,auVar4);
      auVar4 = vpmaddubsw_avx2(auVar23,auVar18);
      auVar23 = vpmaddubsw_avx2(auVar5,auVar17);
      auVar4 = vpaddw_avx2(auVar4,auVar23);
      auVar20 = vpaddw_avx2(auVar20,auVar19);
      auVar21 = vpaddw_avx2(auVar21,auVar19);
      auVar22 = vpaddw_avx2(auVar22,auVar19);
      auVar4 = vpaddw_avx2(auVar4,auVar19);
      auVar23 = vpsraw_avx2(auVar20,6);
      auVar20 = vpsraw_avx2(auVar21,6);
      auVar20 = vpackuswb_avx2(auVar23,auVar20);
      auVar22 = vpsraw_avx2(auVar22,6);
      auVar21 = vpsraw_avx2(auVar4,6);
      auVar21 = vpackuswb_avx2(auVar22,auVar21);
      *(undefined1 (*) [32])((long)dst + 0x40) = auVar20;
      *(undefined1 (*) [32])((long)dst + 0x60) = auVar21;
      dst = *(undefined1 (*) [32])dst + i_dst;
      height = height + -1;
    } while (height != 0);
  }
  return;
}

Assistant:

void uavs3d_if_ver_chroma_w128_avx2(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, const s8 *coeff, int max_val)
{
    const int offset = 32;
    const int shift = 6;
    __m256i mAddOffset = _mm256_set1_epi16(offset);
    const int i_src2 = i_src * 2;
    const int i_src3 = i_src * 3;
    __m256i coeff0 = _mm256_set1_epi16(*(s16*)coeff);
    __m256i coeff1 = _mm256_set1_epi16(*(s16*)(coeff + 2));
    __m256i S0, S1, S2, S3, S4, S5, S6, S7;
    __m256i T0, T1, T2, T3, T4, T5, T6, T7, mVal0, mVal1, mVal2, mVal3;

    src -= i_src;

    while (height--) {
        S0 = _mm256_loadu_si256((__m256i*)(src));
        S4 = _mm256_loadu_si256((__m256i*)(src + 32));
        S1 = _mm256_loadu_si256((__m256i*)(src + i_src));
        S5 = _mm256_loadu_si256((__m256i*)(src + i_src + 32));
        S2 = _mm256_loadu_si256((__m256i*)(src + i_src2));
        S6 = _mm256_loadu_si256((__m256i*)(src + i_src2 + 32));
        S3 = _mm256_loadu_si256((__m256i*)(src + i_src3));
        S7 = _mm256_loadu_si256((__m256i*)(src + i_src3 + 32));

        T0 = _mm256_unpacklo_epi8(S0, S1);
        T1 = _mm256_unpacklo_epi8(S2, S3);
        T2 = _mm256_unpackhi_epi8(S0, S1);
        T3 = _mm256_unpackhi_epi8(S2, S3);
        T4 = _mm256_unpacklo_epi8(S4, S5);
        T5 = _mm256_unpacklo_epi8(S6, S7);
        T6 = _mm256_unpackhi_epi8(S4, S5);
        T7 = _mm256_unpackhi_epi8(S6, S7);

        T0 = _mm256_maddubs_epi16(T0, coeff0);
        T1 = _mm256_maddubs_epi16(T1, coeff1);
        T2 = _mm256_maddubs_epi16(T2, coeff0);
        T3 = _mm256_maddubs_epi16(T3, coeff1);
        T4 = _mm256_maddubs_epi16(T4, coeff0);
        T5 = _mm256_maddubs_epi16(T5, coeff1);
        T6 = _mm256_maddubs_epi16(T6, coeff0);
        T7 = _mm256_maddubs_epi16(T7, coeff1);

        mVal0 = _mm256_add_epi16(T0, T1);
        mVal1 = _mm256_add_epi16(T2, T3);
        mVal2 = _mm256_add_epi16(T4, T5);
        mVal3 = _mm256_add_epi16(T6, T7);

        mVal0 = _mm256_add_epi16(mVal0, mAddOffset);
        mVal1 = _mm256_add_epi16(mVal1, mAddOffset);
        mVal2 = _mm256_add_epi16(mVal2, mAddOffset);
        mVal3 = _mm256_add_epi16(mVal3, mAddOffset);
        mVal0 = _mm256_srai_epi16(mVal0, shift);
        mVal1 = _mm256_srai_epi16(mVal1, shift);
        mVal2 = _mm256_srai_epi16(mVal2, shift);
        mVal3 = _mm256_srai_epi16(mVal3, shift);
        mVal0 = _mm256_packus_epi16(mVal0, mVal1);
        mVal1 = _mm256_packus_epi16(mVal2, mVal3);

        _mm256_storeu_si256((__m256i*)(dst), mVal0);
        _mm256_storeu_si256((__m256i*)(dst + 32), mVal1);

        S0 = _mm256_loadu_si256((__m256i*)(src + 64));
        S4 = _mm256_loadu_si256((__m256i*)(src + 96));
        S1 = _mm256_loadu_si256((__m256i*)(src + i_src + 64));
        S5 = _mm256_loadu_si256((__m256i*)(src + i_src + 96));
        S2 = _mm256_loadu_si256((__m256i*)(src + i_src2 + 64));
        S6 = _mm256_loadu_si256((__m256i*)(src + i_src2 + 96));
        S3 = _mm256_loadu_si256((__m256i*)(src + i_src3 + 64));
        S7 = _mm256_loadu_si256((__m256i*)(src + i_src3 + 96));

        src += i_src;
        uavs3d_prefetch(src + i_src3, _MM_HINT_NTA);

        T0 = _mm256_unpacklo_epi8(S0, S1);
        T1 = _mm256_unpacklo_epi8(S2, S3);
        T2 = _mm256_unpackhi_epi8(S0, S1);
        T3 = _mm256_unpackhi_epi8(S2, S3);
        T4 = _mm256_unpacklo_epi8(S4, S5);
        T5 = _mm256_unpacklo_epi8(S6, S7);
        T6 = _mm256_unpackhi_epi8(S4, S5);
        T7 = _mm256_unpackhi_epi8(S6, S7);

        T0 = _mm256_maddubs_epi16(T0, coeff0);
        T1 = _mm256_maddubs_epi16(T1, coeff1);
        T2 = _mm256_maddubs_epi16(T2, coeff0);
        T3 = _mm256_maddubs_epi16(T3, coeff1);
        T4 = _mm256_maddubs_epi16(T4, coeff0);
        T5 = _mm256_maddubs_epi16(T5, coeff1);
        T6 = _mm256_maddubs_epi16(T6, coeff0);
        T7 = _mm256_maddubs_epi16(T7, coeff1);

        mVal0 = _mm256_add_epi16(T0, T1);
        mVal1 = _mm256_add_epi16(T2, T3);
        mVal2 = _mm256_add_epi16(T4, T5);
        mVal3 = _mm256_add_epi16(T6, T7);

        mVal0 = _mm256_add_epi16(mVal0, mAddOffset);
        mVal1 = _mm256_add_epi16(mVal1, mAddOffset);
        mVal2 = _mm256_add_epi16(mVal2, mAddOffset);
        mVal3 = _mm256_add_epi16(mVal3, mAddOffset);
        mVal0 = _mm256_srai_epi16(mVal0, shift);
        mVal1 = _mm256_srai_epi16(mVal1, shift);
        mVal2 = _mm256_srai_epi16(mVal2, shift);
        mVal3 = _mm256_srai_epi16(mVal3, shift);
        mVal0 = _mm256_packus_epi16(mVal0, mVal1);
        mVal1 = _mm256_packus_epi16(mVal2, mVal3);

        _mm256_storeu_si256((__m256i*)(dst + 64), mVal0);
        _mm256_storeu_si256((__m256i*)(dst + 96), mVal1);

        dst += i_dst;
    }
}